

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printdef(char *name,char *suf,int type,uint64_t val,char *file)

{
  int local_3c;
  FILE *pFStack_38;
  int len;
  FILE *dst;
  char *file_local;
  uint64_t val_local;
  char *pcStack_18;
  int type_local;
  char *suf_local;
  char *name_local;
  
  dst = (FILE *)file;
  file_local = (char *)val;
  val_local._4_4_ = type;
  pcStack_18 = suf;
  suf_local = name;
  pFStack_38 = (FILE *)findfout(file);
  if (pcStack_18 == (char *)0x0) {
    fprintf(pFStack_38,"#define %s%n",suf_local,&local_3c);
  }
  else {
    fprintf(pFStack_38,"#define %s__%s%n",suf_local,pcStack_18,&local_3c);
  }
  if ((val_local._4_4_ == 0) && ((char *)0xffffffff < file_local)) {
    seekcol((FILE *)pFStack_38,local_3c,startcol + -8);
  }
  else {
    seekcol((FILE *)pFStack_38,local_3c,startcol);
  }
  if (val_local._4_4_ == 0) {
    if (file_local < (char *)0x100000000) {
      fprintf(pFStack_38,"0x%08lx\n",file_local);
    }
    else {
      fprintf(pFStack_38,"0x%016lxULL\n",file_local);
    }
  }
  else if (val_local._4_4_ == 1) {
    fprintf(pFStack_38,"%lu\n",file_local);
  }
  return;
}

Assistant:

void printdef (char *name, char *suf, int type, uint64_t val, char *file) {
	FILE *dst = findfout(file);
	int len;
	if (suf)
		fprintf (dst, "#define %s__%s%n", name, suf, &len);
	else
		fprintf (dst, "#define %s%n", name, &len);
	if (type == 0 && val > 0xffffffffull)
		seekcol (dst, len, startcol-8);
	else
		seekcol (dst, len, startcol);
	switch (type) {
		case 0:
			if (val > 0xffffffffull)
				fprintf (dst, "0x%016"PRIx64"ULL\n", val);
			else
				fprintf (dst, "0x%08"PRIx64"\n", val);
			break;
		case 1:
			fprintf (dst, "%"PRIu64"\n", val);
			break;
	}
}